

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_lifecycle_hooks.cpp
# Opt level: O2

shared_ptr<TestClientContextState,_true> WithLifecycleState(Connection *conn)

{
  ClientContext *pCVar1;
  pointer this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<duckdb::ClientContext,_true> *in_RSI;
  shared_ptr<TestClientContextState,_true> sVar2;
  allocator local_49;
  __shared_ptr<duckdb::ClientContextState,(__gnu_cxx::_Lock_policy)2> local_48 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  string local_38;
  
  pCVar1 = duckdb::shared_ptr<duckdb::ClientContext,_true>::operator->(in_RSI);
  duckdb::make_shared_ptr<TestClientContextState>();
  this = duckdb::
         unique_ptr<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>,_true>
         ::operator->((unique_ptr<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>,_true>
                       *)(pCVar1 + 0x28));
  std::__cxx11::string::string((string *)&local_38,"test_state",&local_49);
  std::__shared_ptr<duckdb::ClientContextState,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<TestClientContextState,void>
            (local_48,(__shared_ptr<TestClientContextState,_(__gnu_cxx::_Lock_policy)2> *)conn);
  duckdb::RegisteredStateManager::Insert
            (this,&local_38,(shared_ptr<duckdb::ClientContextState,_true> *)local_48);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
  std::__cxx11::string::~string((string *)&local_38);
  sVar2.internal.super___shared_ptr<TestClientContextState,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar2.internal.super___shared_ptr<TestClientContextState,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)conn;
  return (shared_ptr<TestClientContextState,_true>)
         sVar2.internal.super___shared_ptr<TestClientContextState,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<TestClientContextState> WithLifecycleState(const Connection &conn) {
	auto &register_state = conn.context->registered_state;
	auto state = make_shared_ptr<TestClientContextState>();
	register_state->Insert("test_state", state);
	return state;
}